

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O0

int GetPowerMeasurements(void)

{
  FILE *__stream;
  int iVar1;
  double dVar2;
  int local_c;
  
  current_consumption_raw = 0;
  iVar1 = GetAnalogInputOntrak(&ontrak,1,&current_consumption_raw);
  if (iVar1 == 0) {
    battery_voltage_raw = 0;
    iVar1 = GetAnalogInputOntrak(&ontrak,2,&battery_voltage_raw);
    if (iVar1 == 0) {
      current_generation_raw = 0;
      iVar1 = GetAnalogInputOntrak(&ontrak,0,&current_generation_raw);
      if (iVar1 == 0) {
        estimated_energy_consumption =
             (((double)battery_voltage_raw / 4095.0) * 5.0 * 15.0 *
              ((double)current_consumption_raw / 4095.0) * 5.0 * (t_ontrak - t0_ontrak)) / 3600.0 +
             estimated_energy_consumption;
        water_ingress0_raw = 0;
        iVar1 = GetDigitalInputOntrak(&ontrak,0,&water_ingress0_raw);
        if (iVar1 == 0) {
          water_ingress1_raw = 0;
          iVar1 = GetDigitalInputOntrak(&ontrak,1,&water_ingress1_raw);
          if (iVar1 == 0) {
            if (water_ingress0_raw != 1) {
              printf("Water ingress 0 : WATER DETECTED.\n");
              fflush(_stdout);
            }
            if (water_ingress1_raw != 1) {
              printf("Water ingress 1 : WATER DETECTED.\n");
              fflush(_stdout);
            }
            __stream = logpowerfile_ontrak;
            dVar2 = GetTimeElapsedChronoQuick(&chrono_power);
            fprintf((FILE *)__stream,"%f;%f;%f;%f;%f;%d;%d;\n",dVar2,
                    ((double)current_consumption_raw / 4095.0) * 5.0,
                    ((double)battery_voltage_raw / 4095.0) * 5.0 * 15.0,
                    ((double)current_generation_raw / 4095.0) * 5.0,estimated_energy_consumption,
                    (ulong)(uint)water_ingress0_raw,(ulong)(uint)water_ingress1_raw);
            fflush((FILE *)logpowerfile_ontrak);
            local_c = 0;
          }
          else {
            local_c = 1;
          }
        }
        else {
          local_c = 1;
        }
      }
      else {
        local_c = 1;
      }
    }
    else {
      local_c = 1;
    }
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int GetPowerMeasurements(void)
{
	current_consumption_raw = 0;
	if (GetAnalogInputOntrak(&ontrak, CURRENT_CONSUMPTION_CHANNEL_ONTRAK, &current_consumption_raw) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	battery_voltage_raw = 0;
	if (GetAnalogInputOntrak(&ontrak, BATTERY_VOLTAGE_CHANNEL_ONTRAK, &battery_voltage_raw) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	current_generation_raw = 0;
	if (GetAnalogInputOntrak(&ontrak, CURRENT_GENERATION_CHANNEL_ONTRAK, &current_generation_raw) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	estimated_energy_consumption += ANALOG_INPUT2VOLTAGE_ONTRAK(battery_voltage_raw)*ANALOG_INPUT2CURRENT_ONTRAK(current_consumption_raw)*(t_ontrak-t0_ontrak)/3600.0;

	water_ingress0_raw = 0;
	if (GetDigitalInputOntrak(&ontrak, WATER_INGRESS0_CHANNEL_ONTRAK, &water_ingress0_raw) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	water_ingress1_raw = 0;
	if (GetDigitalInputOntrak(&ontrak, WATER_INGRESS1_CHANNEL_ONTRAK, &water_ingress1_raw) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	if (water_ingress0_raw != 1)
	{
		printf("Water ingress 0 : WATER DETECTED.\n");
		fflush(stdout);
	}
	if (water_ingress1_raw != 1)
	{
		printf("Water ingress 1 : WATER DETECTED.\n");
		fflush(stdout);
	}

	fprintf(logpowerfile_ontrak, "%f;%f;%f;%f;%f;%d;%d;\n",
		GetTimeElapsedChronoQuick(&chrono_power),
		ANALOG_INPUT2CURRENT_ONTRAK(current_consumption_raw),
		ANALOG_INPUT2VOLTAGE_ONTRAK(battery_voltage_raw),
		ANALOG_INPUT2CURRENT_ONTRAK(current_generation_raw),
		estimated_energy_consumption,
		water_ingress0_raw, water_ingress1_raw);
	fflush(logpowerfile_ontrak);

	return EXIT_SUCCESS;
}